

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvDiurnal_kry.c
# Opt level: O1

int main(void)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  N_Vector u;
  UserData data;
  sunrealtype **ppsVar5;
  sunindextype *psVar6;
  long lVar7;
  char *pcVar8;
  UserData paVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  ulong uVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  void *cvode_mem;
  SUNContext sunctx;
  sunrealtype t;
  void *local_50;
  undefined8 local_48;
  double local_40;
  sunrealtype local_38;
  
  local_50 = (void *)0x0;
  uVar4 = SUNContext_Create(0,&local_48);
  if ((int)uVar4 < 0) {
    pcVar8 = "SUNContext_Create";
  }
  else {
    u = (N_Vector)N_VNew_Serial(200,local_48);
    if (u == (N_Vector)0x0) {
      main_cold_4();
      return 1;
    }
    data = (UserData)malloc(0x998);
    lVar12 = 0;
    paVar9 = data;
    do {
      lVar11 = 0;
      do {
        ppsVar5 = (sunrealtype **)SUNDlsMat_newDenseMat(2,2);
        paVar9->P[0][lVar11] = ppsVar5;
        ppsVar5 = (sunrealtype **)SUNDlsMat_newDenseMat(2,2);
        paVar9->Jbd[0][lVar11] = ppsVar5;
        psVar6 = (sunindextype *)SUNDlsMat_newIndexArray(2);
        paVar9->pivot[0][lVar11] = psVar6;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 10);
      lVar12 = lVar12 + 1;
      paVar9 = (UserData)(paVar9->P + 1);
    } while (lVar12 != 10);
    if (data == (UserData)0x0) {
      main_cold_3();
      return 1;
    }
    data->om = 7.272205216643056e-05;
    data->dx = 2.2222222222222223;
    data->dy = 2.2222222222222223;
    data->hdco = 8.099999999999999e-07;
    data->haco = 0.000225;
    data->vdco = 2.025e-09;
    lVar12 = N_VGetArrayPointer(u);
    auVar3 = _DAT_001040d0;
    auVar2 = _DAT_00104050;
    lVar11 = 0;
    dVar18 = (double)DAT_00104050;
    dVar19 = DAT_00104050._8_8_;
    do {
      dVar13 = ((double)(int)lVar11 * 2.2222222222222223 + 30.0 + -40.0) * 0.1;
      dVar13 = dVar13 * dVar13;
      dVar13 = dVar13 * dVar13 * 0.5 + (1.0 - dVar13);
      lVar7 = -0xa0;
      uVar14 = 0x100000000;
      do {
        iVar10 = (int)(uVar14 >> 0x20);
        auVar16._0_8_ = uVar14 & 0xffffffff;
        auVar16._8_4_ = iVar10;
        auVar16._12_4_ = 0;
        dVar15 = ((SUB168(auVar16 | auVar2,0) - dVar18) * 2.2222222222222223 + 0.0 + -10.0) * 0.1;
        dVar17 = ((SUB168(auVar16 | auVar2,8) - dVar19) * 2.2222222222222223 + 0.0 + -10.0) * 0.1;
        dVar15 = dVar15 * dVar15;
        dVar17 = dVar17 * dVar17;
        dVar15 = dVar15 * dVar15 * 0.5 + (1.0 - dVar15);
        dVar17 = dVar17 * dVar17 * 0.5 + (1.0 - dVar17);
        pdVar1 = (double *)(lVar12 + 0xb0 + lVar7);
        *pdVar1 = dVar17 * 1000000.0 * dVar13;
        pdVar1[1] = dVar17 * 1000000000000.0 * dVar13;
        pdVar1 = (double *)(lVar12 + 0xa0 + lVar7);
        *pdVar1 = dVar15 * 1000000.0 * dVar13;
        pdVar1[1] = dVar15 * 1000000000000.0 * dVar13;
        uVar14 = CONCAT44(iVar10 + auVar3._4_4_,(int)uVar14 + auVar3._0_4_);
        lVar7 = lVar7 + 0x20;
      } while (lVar7 != 0);
      lVar11 = lVar11 + 1;
      lVar12 = lVar12 + 0xa0;
    } while (lVar11 != 10);
    local_50 = (void *)CVodeCreate(2,local_48);
    if (local_50 == (void *)0x0) {
      main_cold_2();
      return 1;
    }
    uVar4 = CVodeSetUserData(local_50,data);
    if ((int)uVar4 < 0) {
      pcVar8 = "CVodeSetUserData";
    }
    else {
      uVar4 = CVodeInit(0,local_50,f,u);
      if ((int)uVar4 < 0) {
        pcVar8 = "CVodeInit";
      }
      else {
        uVar4 = CVodeSStolerances(0x3ee4f8b588e368f1,0x3f50624dd2f1a9fc,local_50);
        if ((int)uVar4 < 0) {
          pcVar8 = "CVodeSStolerances";
        }
        else {
          lVar12 = SUNLinSol_SPGMR(u,1,0,local_48);
          if (lVar12 == 0) {
            main_cold_1();
            return 1;
          }
          uVar4 = CVodeSetLinearSolver(local_50,lVar12,0);
          if ((int)uVar4 < 0) {
            pcVar8 = "CVodeSetLinearSolver";
          }
          else {
            uVar4 = CVodeSetJacTimes(local_50,0,jtv);
            if ((int)uVar4 < 0) {
              pcVar8 = "CVodeSetJacTimes";
            }
            else {
              uVar4 = CVodeSetPreconditioner(local_50,Precond,PSolve);
              if (-1 < (int)uVar4) {
                puts(" \n2-species diurnal advection-diffusion problem\n");
                dVar18 = 7200.0;
                iVar10 = 0xc;
                do {
                  local_40 = dVar18;
                  uVar4 = CVode(local_50,u,&local_38,1);
                  PrintOutput(local_50,u,local_38);
                  if ((int)uVar4 < 0) {
                    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVode",
                            (ulong)uVar4);
                    break;
                  }
                  dVar18 = local_40 + 7200.0;
                  iVar10 = iVar10 + -1;
                } while (iVar10 != 0);
                PrintFinalStats(local_50);
                N_VDestroy(u);
                FreeUserData(data);
                CVodeFree(&local_50);
                SUNLinSolFree(lVar12);
                SUNContext_Free(&local_48);
                return 0;
              }
              pcVar8 = "CVodeSetPreconditioner";
            }
          }
        }
      }
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar8,(ulong)uVar4);
  return 1;
}

Assistant:

int main(void)
{
  SUNContext sunctx;
  sunrealtype abstol, reltol, t, tout;
  N_Vector u;
  UserData data;
  SUNLinearSolver LS;
  void* cvode_mem;
  int iout, retval;

  u         = NULL;
  data      = NULL;
  LS        = NULL;
  cvode_mem = NULL;

  /* Create the SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Allocate memory, and set problem data, initial values, tolerances */
  u = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u, "N_VNew_Serial", 0)) { return (1); }
  data = AllocUserData();
  if (check_retval((void*)data, "AllocUserData", 2)) { return (1); }
  InitUserData(data);
  SetInitialProfiles(u, data->dx, data->dy);
  abstol = ATOL;
  reltol = RTOL;

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Set the pointer to user-defined data */
  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in u'=f(t,u), the initial time T0, and
   * the initial dependent variable vector u. */
  retval = CVodeInit(cvode_mem, f, T0, u);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeSStolerances to specify the scalar relative tolerance
   * and scalar absolute tolerances */
  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Call SUNLinSol_SPGMR to specify the linear solver SPGMR
   * with left preconditioning and the default Krylov dimension */
  LS = SUNLinSol_SPGMR(u, SUN_PREC_LEFT, 0, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

  /* Call CVodeSetLinearSolver to attach the linear solver to CVode */
  retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

  /* set the JAcobian-times-vector function */
  retval = CVodeSetJacTimes(cvode_mem, NULL, jtv);
  if (check_retval(&retval, "CVodeSetJacTimes", 1)) { return (1); }

  /* Set the preconditioner solve and setup functions */
  retval = CVodeSetPreconditioner(cvode_mem, Precond, PSolve);
  if (check_retval(&retval, "CVodeSetPreconditioner", 1)) { return (1); }

  /* In loop over output points, call CVode, print results, test for error */
  printf(" \n2-species diurnal advection-diffusion problem\n\n");
  for (iout = 1, tout = TWOHR; iout <= NOUT; iout++, tout += TWOHR)
  {
    retval = CVode(cvode_mem, tout, u, &t, CV_NORMAL);
    PrintOutput(cvode_mem, u, t);
    if (check_retval(&retval, "CVode", 1)) { break; }
  }

  PrintFinalStats(cvode_mem);

  /* Free memory */
  N_VDestroy(u);
  FreeUserData(data);
  CVodeFree(&cvode_mem);
  SUNLinSolFree(LS);
  SUNContext_Free(&sunctx);

  return (0);
}